

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O0

void __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
::intrusive_shared_ptr_t
          (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
           *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
                 *p)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  *p_local;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>_>
  *this_local;
  
  this->_t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>
              *)0x0;
  reset(this,p->_t);
  reset(p,(make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_simulate::node_t,_tchecker::tck_simulate::edge_t>,_unsigned_long,_1UL>
           *)0x0);
  return;
}

Assistant:

intrusive_shared_ptr_t(tchecker::intrusive_shared_ptr_t<T> && p) : _t(nullptr)
  {
    reset(p._t);
    p.reset(nullptr);
  }